

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O1

void __thiscall deqp::gles2::Functional::TexCubeShader::shadeFragments(TexCubeShader *this)

{
  FragmentShadingContext *in_RCX;
  int in_EDX;
  FragmentPacket *in_RSI;
  
  shadeFragments((TexCubeShader *)
                 &this[-1].super_ShaderProgram.m_attributeNames.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,in_RSI,in_EDX,in_RCX);
  return;
}

Assistant:

void shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
	{
		tcu::Vec3 texCoords[4];
		tcu::Vec4 colors[4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		{
			// setup tex coords
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			{
				const tcu::Vec4	coord	= rr::readTriangleVarying<float>(packets[packetNdx], context, 0, fragNdx);
				const float		x		= coord.x()*2.0f - 1.0f;
				const float		y		= coord.y()*2.0f - 1.0f;

				// Swizzle tex coords
				switch (m_face)
				{
					case tcu::CUBEFACE_NEGATIVE_X:	texCoords[fragNdx] = tcu::Vec3(-1.0f,    -y,    +x);		break;
					case tcu::CUBEFACE_POSITIVE_X:	texCoords[fragNdx] = tcu::Vec3(+1.0f,    -y,    -x);		break;
					case tcu::CUBEFACE_NEGATIVE_Y:	texCoords[fragNdx] = tcu::Vec3(   +x, -1.0f,    -y);		break;
					case tcu::CUBEFACE_POSITIVE_Y:	texCoords[fragNdx] = tcu::Vec3(   +x, +1.0f,    +y);		break;
					case tcu::CUBEFACE_NEGATIVE_Z:	texCoords[fragNdx] = tcu::Vec3(   -x,    -y, -1.0f);		break;
					case tcu::CUBEFACE_POSITIVE_Z:	texCoords[fragNdx] = tcu::Vec3(   +x,    -y, +1.0f);		break;
					default:
						DE_ASSERT(false);
				}
			}

			// Sample
			m_uniforms[0].sampler.texCube->sample4(colors, texCoords);

			// Write out
			for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
				rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, colors[fragNdx]);
		}
	}